

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cc
# Opt level: O1

void __thiscall
Sequence::process_cluster_list1
          (Sequence *this,shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *hdr1,
          shared_ptr<Lists<std::shared_ptr<Itemset>_>_> *cluster1,
          shared_ptr<Lists<std::shared_ptr<Itemset>_>_> *cluster2,
          shared_ptr<Lists<std::shared_ptr<Eqclass>_>_> *LargeL,int iter,int eqtype,
          Eqclass_S *parent)

{
  int *piVar1;
  shared_ptr<Itemset> *psVar2;
  element_type *peVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  element_type *peVar6;
  element_type *peVar7;
  pointer piVar8;
  Lists<std::shared_ptr<Eqclass>_> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  element_type *peVar10;
  element_type *peVar11;
  uint uVar12;
  shared_ptr<Lists<std::shared_ptr<Itemset>_>_> *psVar13;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var14;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var15;
  undefined4 in_register_0000008c;
  Eqclass_S EQ;
  Itemset_S ejoin;
  Itemset_S ljoin;
  int msup;
  int esup;
  int lsup;
  Itemset_S mjoin;
  Env *local_b8;
  element_type *peStack_b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  Env *local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  shared_ptr<Eqclass> local_90;
  Eqclass_S local_80;
  Itemset_S local_70;
  Itemset_S local_60;
  element_type *local_50;
  shared_ptr<Lists<std::shared_ptr<Eqclass>_>_> local_48;
  
  local_a8._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(in_register_0000008c,iter);
  local_a0 = this->env;
  ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,iter + -1
               );
  EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Eqclass,std::allocator<Eqclass>,int,int&>
            (&EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount,(Eqclass **)&EQ
             ,(allocator<Eqclass> *)&ejoin,(int *)&ljoin,&eqtype);
  local_50 = (element_type *)LargeL;
  fill_seq_template(&EQ,parent,2);
  ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar3 = (cluster2->
           super___shared_ptr<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  peVar4 = (peVar3->theHead).
           super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var5 = (peVar3->theHead).
           super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
    }
  }
  local_98._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(long)(iter + -1);
  while (p_Var9 = p_Var5, peVar4 != (element_type *)0x0) {
    peVar6 = (hdr1->
             super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    uVar12 = Eqclass::templ(EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    psVar2 = &peVar4->theItem;
    prune_decision((Sequence *)&local_b8,(Itemset_S *)this,psVar2,(int)peVar6 + 0x10,uVar12);
    peVar11 = peStack_b0;
    ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)local_b8;
    _Var15 = ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_b8 = (Env *)0x0;
    peStack_b0 = (element_type *)0x0;
    ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar11;
    if (_Var15._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var15._M_pi);
    }
    _Var15._M_pi = local_98._M_pi;
    if (peStack_b0 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_b0);
    }
    _Var14._M_pi = ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (_Var14._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var14._M_pi);
    }
    _Var14._M_pi = mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (_Var14._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var14._M_pi);
    }
    msup = 0;
    esup = 0;
    lsup = 0;
    if (1 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            pruning_type) {
      uVar12 = Eqclass::templ(EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      _Var14._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
      pre_pruning(this,&ljoin,uVar12,
                  &((hdr1->
                    super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr)->theItem,psVar2,'\x01');
    }
    if (ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
    {
      _Var14._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
      get_tmpnewf_intersect
                (this,&ljoin,&ejoin,&mjoin,&lsup,&esup,&msup,psVar2,
                 &((hdr1->
                   super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr)->theItem,(int)local_a8._M_pi);
    }
    if (ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
    {
      fill_join((Sequence *)_Var14._M_pi,&ljoin,
                &((hdr1->
                  super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr)->theItem,psVar2);
    }
    if (1 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            pruning_type) {
      uVar12 = Eqclass::templ(EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      post_pruning(this,&ljoin,uVar12);
    }
    peVar10 = ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
    {
      peVar7 = (this->numLargeItemset).
               super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      piVar8 = (peVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          ((long)(peVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)piVar8 >> 2) <= _Var15._M_pi) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   _Var15._M_pi);
      }
      piVar1 = piVar8 + (long)_Var15._M_pi;
      *piVar1 = *piVar1 + 1;
      if (((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          outputfreq != '\0') {
        uVar12 = Eqclass::templ(EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        Itemset::print_seq(peVar10,(ostream *)local_a0,uVar12);
      }
      local_60.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_60.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
        }
      }
      Eqclass::append(EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&local_60);
      if (local_60.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_60.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
    }
    peVar6 = (peVar4->theNext).
             super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var5 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&(peVar4->theNext).
                     super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
             + 8))->_M_pi;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      }
    }
    peVar4 = peVar6;
    if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
    }
  }
  peVar4 = (hdr1->
           super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar6 = (peVar4->theNext).
           super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var5 = (peVar4->theNext).
           super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
    }
  }
  if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
  }
  while (p_Var9 = p_Var5, peVar6 != (element_type *)0x0) {
    peVar4 = (hdr1->
             super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    uVar12 = Eqclass::templ2(EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    psVar2 = &peVar6->theItem;
    prune_decision((Sequence *)&local_b8,(Itemset_S *)this,psVar2,(int)peVar4 + 0x10,uVar12);
    peVar11 = peStack_b0;
    ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)local_b8;
    _Var15 = ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_b8 = (Env *)0x0;
    peStack_b0 = (element_type *)0x0;
    ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar11;
    if (_Var15._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var15._M_pi);
    }
    _Var15._M_pi = local_98._M_pi;
    if (peStack_b0 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_b0);
    }
    _Var14._M_pi = ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (_Var14._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var14._M_pi);
    }
    _Var14._M_pi = mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (_Var14._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var14._M_pi);
    }
    msup = 0;
    esup = 0;
    lsup = 0;
    if (1 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            pruning_type) {
      uVar12 = Eqclass::templ2(EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      _Var14._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
      pre_pruning(this,&ejoin,uVar12,
                  &((hdr1->
                    super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr)->theItem,psVar2,'\0');
    }
    if (ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
    {
      _Var14._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
      get_tmpnewf_intersect
                (this,&ljoin,&ejoin,&mjoin,&lsup,&esup,&msup,psVar2,
                 &((hdr1->
                   super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr)->theItem,(int)local_a8._M_pi);
    }
    if (ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
    {
      fill_join((Sequence *)_Var14._M_pi,&ejoin,
                &((hdr1->
                  super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr)->theItem,psVar2);
    }
    if (1 < ((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            pruning_type) {
      uVar12 = Eqclass::templ2(EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      post_pruning(this,&ejoin,uVar12);
    }
    peVar10 = ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
    {
      peVar7 = (this->numLargeItemset).
               super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      piVar8 = (peVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          ((long)(peVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)piVar8 >> 2) <= _Var15._M_pi) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   _Var15._M_pi);
      }
      piVar1 = piVar8 + (long)_Var15._M_pi;
      *piVar1 = *piVar1 + 1;
      if (((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          outputfreq != '\0') {
        uVar12 = Eqclass::templ2(EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        Itemset::print_seq(peVar10,(ostream *)local_a0,uVar12);
      }
      local_70.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_70.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
        }
      }
      Eqclass::append2(EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&local_70);
      if (local_70.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_70.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
    }
    peVar4 = (peVar6->theNext).
             super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var5 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&(peVar6->theNext).
                     super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
             + 8))->_M_pi;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      }
    }
    peVar6 = peVar4;
    if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
    }
  }
  if (EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (Eqclass *)0x0)
  goto LAB_0011019f;
  psVar13 = Eqclass::list(EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if ((((psVar13->super___shared_ptr<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr)->theSize < 1) &&
     (psVar13 = Eqclass::list2(EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr),
     ((psVar13->super___shared_ptr<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>).
     _M_ptr)->theSize < 1)) {
LAB_00110171:
    _Var15._M_pi = EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (((this->args).super___shared_ptr<SpadeArguments,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        recursive != 0) {
      local_80.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_80.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
        }
      }
      local_48.super___shared_ptr<Lists<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_48.super___shared_ptr<Lists<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      process_cluster1(this,&local_80,&local_48,(int)local_a8._M_pi + 1);
      if (local_48.super___shared_ptr<Lists<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.
                   super___shared_ptr<Lists<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_80.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_80.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      goto LAB_00110171;
    }
    this_00 = ((__shared_ptr<Lists<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2> *)
              &local_50->theArray)->_M_ptr;
    local_90.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_90.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
             = (EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
        UNLOCK();
      }
      else {
        (EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count
             = (EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
      }
    }
    Lists<std::shared_ptr<Eqclass>_>::append(this_00,&local_90);
    _Var15._M_pi = local_90.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
  }
  if (_Var15._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var15._M_pi);
  }
LAB_0011019f:
  if (mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (mjoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (ejoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (ljoin.super___shared_ptr<Itemset,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (EQ.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
  }
  return;
}

Assistant:

void Sequence::process_cluster_list1(shared_ptr<ListNodes<shared_ptr<Itemset>>>& hdr1,
                                     shared_ptr<Lists<shared_ptr<Itemset>>>& cluster1,
                                     shared_ptr<Lists<shared_ptr<Itemset>>>& cluster2,
                                     shared_ptr<Lists<Eqclass_S>>& LargeL,
                                     int iter, int eqtype, Eqclass_S& parent) {

    ostringstream &logger = env.logger;
    ostringstream &seqstrm = env.seqstrm;

    shared_ptr<ListNodes<shared_ptr<Itemset>>> hdr2;
    Eqclass_S EQ = make_shared<Eqclass>(iter - 1, eqtype);
    fill_seq_template(EQ, parent, 2);

    Itemset_S ljoin, ejoin, mjoin;
    int lsup, esup, msup;
    hdr2 = cluster2->head();
    for (; hdr2; hdr2 = hdr2->next()) {
        //ljoin = (Itemset_S )1;
        ljoin = prune_decision(hdr2->item(), hdr1->item(), EQ->templ(), LJOIN);
        ejoin = nullptr;
        mjoin = nullptr;
        lsup = esup = msup = 0;
        if (args->pruning_type > 1)
            pre_pruning(ljoin, EQ->templ(), hdr1->item(), hdr2->item(), 1);
        if (ljoin) get_tmpnewf_intersect(ljoin, ejoin, mjoin, lsup, esup, msup, hdr2->item(), hdr1->item(), iter);
        if (ljoin) fill_join(ljoin, hdr1->item(), hdr2->item());
        if (args->pruning_type > 1) {
            post_pruning(ljoin, EQ->templ());
        }
        if (ljoin) {
            numLargeItemset->at(iter - 1)++;
            //fill_join(ljoin, hdr1->item(), hdr2->item());
            if (args->outputfreq) ljoin->print_seq(seqstrm, EQ->templ());
            EQ->append(ljoin);
        }
    }

    //hdr2 = cluster1->head();
    //for (; hdr2 != hdr1; hdr2=hdr2->next()){
    hdr2 = hdr1->next();
    for (; hdr2 != nullptr; hdr2 = hdr2->next()) {
        //ejoin = (Itemset_S )1;
        ejoin = prune_decision(hdr2->item(), hdr1->item(), EQ->templ2(), EJOIN);
        ljoin = nullptr;
        mjoin = nullptr;
        lsup = esup = msup = 0;
        if (args->pruning_type > 1)
            pre_pruning(ejoin, EQ->templ2(), hdr1->item(), hdr2->item(), 0);
        if (ejoin) get_tmpnewf_intersect(ljoin, ejoin, mjoin, lsup, esup, msup, hdr2->item(), hdr1->item(), iter);
        if (ejoin) fill_join(ejoin, hdr1->item(), hdr2->item());
        if (args->pruning_type > 1) post_pruning(ejoin, EQ->templ2());
        if (ejoin) {
            numLargeItemset->at(iter - 1)++;
            //fill_join(ejoin, hdr1->item(), hdr2->item());
            if (args->outputfreq) ejoin->print_seq(seqstrm, EQ->templ2());
            EQ->append2(ejoin);
        }
    }

    if (EQ) {
        if ((EQ->list()->size() > 0) || (EQ->list2()->size() > 0)) {
            if (args->recursive) {
                //if (use_hash) insert_freqarray(EQ);
                process_cluster1(EQ, nullptr, iter + 1);
                EQ = nullptr;
            } else LargeL->append(EQ);
        } else {
            EQ = nullptr;
        }
    }
}